

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,void *value)

{
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RSI;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RDI;
  iterator iVar1;
  undefined7 in_stack_ffffffffffffffb8;
  char cVar2;
  void *in_stack_ffffffffffffffd8;
  
  if (in_RDI->specs_ != (format_specs *)0x0) {
    cVar2 = (in_RDI->specs_->super_core_format_specs).type;
    error_handler::error_handler((error_handler *)&stack0xffffffffffffffdf);
    check_pointer_type_spec<char,fmt::v5::internal::error_handler>
              ((char)((ulong)in_RDI >> 0x38),
               (error_handler *)CONCAT17(cVar2,in_stack_ffffffffffffffb8));
  }
  write_pointer(in_RSI,in_stack_ffffffffffffffd8);
  iVar1 = out(in_RDI);
  return iVar1;
}

Assistant:

iterator operator()(const void *value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }